

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O0

void __thiscall riffcpp::Chunk::Chunk(Chunk *this,void *buffer,size_t len)

{
  streampos *psVar1;
  uint32_t uVar2;
  Error *pEVar3;
  impl *this_00;
  element_type *peVar4;
  streamoff sVar5;
  streamoff sVar6;
  fpos<__mbstate_t> local_e8;
  streamoff local_d8;
  __mbstate_t _Stack_d0;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_c8;
  streamoff local_b8;
  __mbstate_t _Stack_b0;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_a0;
  _Type local_8c;
  streampos local_88;
  streampos local_78;
  element_type *local_68;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_60;
  size_t local_50;
  shared_ptr<membuffer> local_48;
  size_t local_38;
  char *charbuf;
  size_t local_20;
  size_t len_local;
  void *buffer_local;
  Chunk *this_local;
  
  local_20 = len;
  len_local = (size_t)buffer;
  buffer_local = this;
  if (buffer == (void *)0x0) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar3,"Null buffer",NullBuffer);
    __cxa_throw(pEVar3,&Error::typeinfo,0);
  }
  this_00 = (impl *)operator_new(0x48);
  (this_00->m_limit)._M_off = 0;
  (this_00->m_limit)._M_state.__count = 0;
  (this_00->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_pos)._M_off = 0;
  (this_00->m_pos)._M_state.__count = 0;
  (this_00->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00->m_id = (_Type)0x0;
  this_00->m_size = 0;
  impl::impl(this_00);
  this->pimpl = this_00;
  local_38 = len_local;
  local_50 = len_local;
  std::make_shared<membuffer,char*,unsigned_long&>((char **)&local_48,&local_50);
  std::shared_ptr<std::streambuf>::operator=
            ((shared_ptr<std::streambuf> *)&this->pimpl->m_buf,&local_48);
  std::shared_ptr<membuffer>::~shared_ptr(&local_48);
  local_68 = std::
             __shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ::get(&(this->pimpl->m_buf).
                    super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
  std::make_shared<std::istream,std::streambuf*>
            ((basic_streambuf<char,_std::char_traits<char>_> **)&local_60);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::operator=
            (&this->pimpl->m_stream,&local_60);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_60);
  std::
  __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this->pimpl);
  local_78 = (streampos)std::istream::tellg();
  this->pimpl->m_pos = local_78;
  peVar4 = std::
           __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->pimpl);
  std::istream::seekg((long)peVar4,_S_beg);
  std::
  __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this->pimpl);
  local_88 = (streampos)std::istream::tellg();
  this->pimpl->m_limit = local_88;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::shared_ptr
            (&local_a0,&this->pimpl->m_stream);
  psVar1 = &this->pimpl->m_pos;
  local_b8 = psVar1->_M_off;
  _Stack_b0 = (this->pimpl->m_pos)._M_state;
  local_8c = (_Type)read_id(&local_a0,*psVar1);
  *&(this->pimpl->m_id)._M_elems = local_8c;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_a0);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::shared_ptr
            (&local_c8,&this->pimpl->m_stream);
  psVar1 = &this->pimpl->m_pos;
  local_d8 = psVar1->_M_off;
  _Stack_d0 = (this->pimpl->m_pos)._M_state;
  uVar2 = read_size(&local_c8,*psVar1);
  this->pimpl->m_size = uVar2;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_c8);
  local_e8 = std::fpos<__mbstate_t>::operator+(&this->pimpl->m_pos,(ulong)this->pimpl->m_size);
  sVar5 = std::fpos::operator_cast_to_long((fpos *)&local_e8);
  sVar6 = std::fpos::operator_cast_to_long((fpos *)&this->pimpl->m_limit);
  if (sVar6 < sVar5) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar3,"Chunk size outside of range",InvalidFile);
    __cxa_throw(pEVar3,&Error::typeinfo,0);
  }
  return;
}

Assistant:

riffcpp::Chunk::Chunk(const void *buffer, std::size_t len) {
  if (buffer == nullptr) {
    throw Error("Null buffer", ErrorType::NullBuffer);
  }

  pimpl = new riffcpp::Chunk::impl();

  const char *charbuf = static_cast<const char *>(buffer);

  pimpl->m_buf = std::make_shared<membuffer>(const_cast<char *>(charbuf), len);
  pimpl->m_stream = std::make_shared<std::istream>(pimpl->m_buf.get());
  pimpl->m_pos = pimpl->m_stream->tellg();
  pimpl->m_stream->seekg(0, std::ios::end);
  pimpl->m_limit = pimpl->m_stream->tellg();

  pimpl->m_id = read_id(pimpl->m_stream, pimpl->m_pos);
  pimpl->m_size = read_size(pimpl->m_stream, pimpl->m_pos);

  if (pimpl->m_pos + std::streamoff{pimpl->m_size} > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
}